

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

size_t put_uint(MIR_context_t ctx,writer_func_t writer,uint64_t u,int nb)

{
  uint uVar1;
  bool bVar2;
  
  uVar1 = ~(nb >> 0x1f) & nb;
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    put_byte(ctx,writer,(uint)u & 0xff);
    u = u >> 8;
  }
  return (long)nb;
}

Assistant:

static size_t put_uint (MIR_context_t ctx, writer_func_t writer, uint64_t u, int nb) {
  if (writer == NULL) return 0;
  for (int n = 0; n < nb; n++) {
    put_byte (ctx, writer, u & 0xff);
    u >>= CHAR_BIT;
  }
  return nb;
}